

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_opaque(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t sz;
  void *pdata;
  int32_t isz;
  int32_t local_1c;
  void *local_18;
  int local_c;
  
  local_1c = 0;
  local_18 = (void *)0x0;
  eVar1 = exr_attr_opaquedata_pack(ctxt,(a->field_6).opaque,&local_1c,&local_18);
  if (eVar1 == 0) {
    if (local_1c < 0) {
      eVar1 = (*ctxt->standard_error)(ctxt,3);
    }
    else {
      local_c = local_1c;
      eVar1 = (*ctxt->do_write)(ctxt,&local_c,4,&ctxt->output_file_offset);
    }
    if (0 < local_1c && eVar1 == 0) {
      eVar1 = (*ctxt->do_write)(ctxt,local_18,(uint64_t)local_1c,&ctxt->output_file_offset);
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_opaque (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    int32_t      sz    = 0;
    void*        pdata = NULL;

    rv =
        exr_attr_opaquedata_pack ((exr_context_t) ctxt, a->opaque, &sz, &pdata);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = save_attr_sz (ctxt, (uint64_t) sz);
    if (rv == EXR_ERR_SUCCESS && sz > 0)
        rv = ctxt->do_write (
            ctxt, pdata, (uint64_t) sz, &(ctxt->output_file_offset));
    return rv;
}